

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool __thiscall ImGuiListClipper::Step(ImGuiListClipper *this)

{
  float fVar1;
  uint *in_RDI;
  bool ret;
  bool need_items_height;
  ImGuiContext *g;
  ImGuiListClipper *in_stack_00000148;
  bool local_12;
  ImGuiContext *this_00;
  
  fVar1 = (float)in_RDI[3];
  this_00 = GImGui;
  local_12 = ImGuiListClipper_StepInternal(in_stack_00000148);
  if ((local_12) && (*in_RDI == in_RDI[1])) {
    local_12 = false;
  }
  if (((this_00->CurrentTable != (ImGuiTable *)0x0) &&
      ((this_00->CurrentTable->IsUnfrozenRows & 1U) == 0)) &&
     ((this_00->DebugLogFlags & 0x10U) != 0)) {
    ImGui::DebugLog("Clipper: Step(): inside frozen table row.\n");
  }
  if (((fVar1 <= 0.0) && (0.0 < (float)in_RDI[3])) && ((this_00->DebugLogFlags & 0x10U) != 0)) {
    ImGui::DebugLog((char *)(double)(float)in_RDI[3],
                    "Clipper: Step(): computed ItemsHeight: %.2f.\n");
  }
  if (local_12 == false) {
    if ((this_00->DebugLogFlags & 0x10U) != 0) {
      ImGui::DebugLog("Clipper: Step(): End.\n");
    }
  }
  else if ((this_00->DebugLogFlags & 0x10U) != 0) {
    ImGui::DebugLog("Clipper: Step(): display %d to %d.\n",(ulong)*in_RDI,(ulong)in_RDI[1]);
  }
  if (local_12 == false) {
    End((ImGuiListClipper *)this_00);
  }
  return local_12;
}

Assistant:

bool ImGuiListClipper::Step()
{
    ImGuiContext& g = *GImGui;
    bool need_items_height = (ItemsHeight <= 0.0f);
    bool ret = ImGuiListClipper_StepInternal(this);
    if (ret && (DisplayStart == DisplayEnd))
        ret = false;
    if (g.CurrentTable && g.CurrentTable->IsUnfrozenRows == false)
        IMGUI_DEBUG_LOG_CLIPPER("Clipper: Step(): inside frozen table row.\n");
    if (need_items_height && ItemsHeight > 0.0f)
        IMGUI_DEBUG_LOG_CLIPPER("Clipper: Step(): computed ItemsHeight: %.2f.\n", ItemsHeight);
    if (ret)
        IMGUI_DEBUG_LOG_CLIPPER("Clipper: Step(): display %d to %d.\n", DisplayStart, DisplayEnd);
    else
        IMGUI_DEBUG_LOG_CLIPPER("Clipper: Step(): End.\n");
    if (!ret)
        End();
    return ret;
}